

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void OnRPCStarted(void)

{
  function<void_(SynchronizationState,_const_CBlockIndex_*)> fn;
  undefined8 *puVar1;
  long in_FS_OFFSET;
  undefined8 uVar2;
  code *pcVar3;
  connection local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = RPCNotifyBlockChange;
  pcVar3 = std::
           _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_std::_Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)>_>
           ::_M_manager;
  fn.super__Function_base._M_functor._8_8_ = uVar2;
  fn.super__Function_base._M_functor._M_unused._M_object = puVar1;
  fn.super__Function_base._M_manager =
       std::
       _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_std::_Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)>_>
       ::_M_manager;
  fn._M_invoker =
       std::
       _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_std::_Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)>_>
       ::_M_invoke;
  CClientUIInterface::NotifyBlockTip_connect((CClientUIInterface *)&local_20,fn);
  boost::signals2::connection::operator=(&rpc_notify_block_change_connection,&local_20);
  boost::detail::weak_count::~weak_count(&local_20._weak_connection_body.pn);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffffb8,&stack0xffffffffffffffb8,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void OnRPCStarted()
{
    rpc_notify_block_change_connection = uiInterface.NotifyBlockTip_connect(std::bind(RPCNotifyBlockChange, std::placeholders::_2));
}